

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::DecimalFormatProperties::_equals
          (DecimalFormatProperties *this,DecimalFormatProperties *other,bool ignoreForFastFormat)

{
  UBool UVar1;
  char cVar2;
  bool bVar3;
  
  cVar2 = (other->compactStyle).fNull;
  if ((this->compactStyle).fNull == false) {
    if ((bool)cVar2 == false) {
      cVar2 = (this->compactStyle).fValue == (other->compactStyle).fValue;
      goto LAB_0026c047;
    }
  }
  else {
LAB_0026c047:
    if (cVar2 != '\0') {
      cVar2 = (other->currency).fNull;
      if ((this->currency).fNull == false) {
        if ((bool)cVar2 != false) goto LAB_0026c07d;
        UVar1 = MeasureUnit::operator==
                          (&(this->currency).fValue.super_MeasureUnit,
                           (UObject *)&(other->currency).fValue);
        cVar2 = UVar1 != '\0';
      }
      if ((cVar2 != '\0') &&
         ((this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr ==
          (other->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr))
      {
        cVar2 = (other->currencyUsage).fNull;
        if ((this->currencyUsage).fNull == false) {
          if ((bool)cVar2 != false) goto LAB_0026c07d;
          cVar2 = (this->currencyUsage).fValue == (other->currencyUsage).fValue;
        }
        if ((((((cVar2 != '\0') &&
               (this->decimalSeparatorAlwaysShown == other->decimalSeparatorAlwaysShown)) &&
              (this->exponentSignAlwaysShown == other->exponentSignAlwaysShown)) &&
             (((this->formatFailIfMoreThanMaxDigits == other->formatFailIfMoreThanMaxDigits &&
               (this->formatWidth == other->formatWidth)) &&
              ((this->magnitudeMultiplier == other->magnitudeMultiplier &&
               ((this->maximumSignificantDigits == other->maximumSignificantDigits &&
                (this->minimumExponentDigits == other->minimumExponentDigits)))))))) &&
            ((this->minimumGroupingDigits == other->minimumGroupingDigits &&
             (((this->minimumSignificantDigits == other->minimumSignificantDigits &&
               (this->multiplier == other->multiplier)) &&
              (this->multiplierScale == other->multiplierScale)))))) &&
           ((UVar1 = UnicodeString::operator==(&this->negativePrefix,&other->negativePrefix),
            UVar1 != '\0' &&
            (UVar1 = UnicodeString::operator==(&this->negativeSuffix,&other->negativeSuffix),
            UVar1 != '\0')))) {
          cVar2 = (other->padPosition).fNull;
          if ((this->padPosition).fNull == false) {
            if ((bool)cVar2 != false) goto LAB_0026c07d;
            cVar2 = (this->padPosition).fValue == (other->padPosition).fValue;
          }
          if (((cVar2 != '\0') &&
              (UVar1 = UnicodeString::operator==(&this->padString,&other->padString), UVar1 != '\0')
              ) && ((UVar1 = UnicodeString::operator==(&this->positivePrefix,&other->positivePrefix)
                    , UVar1 != '\0' &&
                    (((UVar1 = UnicodeString::operator==
                                         (&this->positiveSuffix,&other->positiveSuffix),
                      UVar1 != '\0' && (this->roundingIncrement == other->roundingIncrement)) &&
                     (!NAN(this->roundingIncrement) && !NAN(other->roundingIncrement))))))) {
            cVar2 = (other->roundingMode).fNull;
            if ((this->roundingMode).fNull == false) {
              if ((bool)cVar2 != false) goto LAB_0026c07d;
              cVar2 = (this->roundingMode).fValue == (other->roundingMode).fValue;
            }
            if ((cVar2 != '\0') && (this->secondaryGroupingSize == other->secondaryGroupingSize)) {
              bVar3 = this->signAlwaysShown == other->signAlwaysShown;
              goto LAB_0026c07f;
            }
          }
        }
      }
    }
  }
LAB_0026c07d:
  bVar3 = false;
LAB_0026c07f:
  if (ignoreForFastFormat) {
    return bVar3;
  }
  if ((((((bVar3 & this->groupingSize == other->groupingSize) == 1) &&
        (this->groupingUsed == other->groupingUsed)) &&
       ((this->minimumFractionDigits == other->minimumFractionDigits &&
        ((((this->maximumFractionDigits == other->maximumFractionDigits &&
           (this->maximumIntegerDigits == other->maximumIntegerDigits)) &&
          (this->minimumIntegerDigits == other->minimumIntegerDigits)) &&
         ((UVar1 = UnicodeString::operator==
                             (&this->negativePrefixPattern,&other->negativePrefixPattern),
          UVar1 != '\0' &&
          (UVar1 = UnicodeString::operator==
                             (&this->negativeSuffixPattern,&other->negativeSuffixPattern),
          UVar1 != '\0')))))))) &&
      (UVar1 = UnicodeString::operator==(&this->positivePrefixPattern,&other->positivePrefixPattern)
      , UVar1 != '\0')) &&
     (((UVar1 = UnicodeString::operator==
                          (&this->positiveSuffixPattern,&other->positiveSuffixPattern),
       UVar1 != '\0' && (this->decimalPatternMatchRequired == other->decimalPatternMatchRequired))
      && ((this->parseCaseSensitive == other->parseCaseSensitive &&
          (this->parseIntegerOnly == other->parseIntegerOnly)))))) {
    cVar2 = (other->parseMode).fNull;
    if ((this->parseMode).fNull == false) {
      if ((bool)cVar2 != false) {
        return false;
      }
      cVar2 = (this->parseMode).fValue == (other->parseMode).fValue;
    }
    if (((cVar2 != '\0') && (this->parseNoExponent == other->parseNoExponent)) &&
       (this->parseToBigDecimal == other->parseToBigDecimal)) {
      return this->parseAllInput == other->parseAllInput;
    }
  }
  return false;
}

Assistant:

bool
DecimalFormatProperties::_equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const {
    bool eq = true;

    // Properties that must be equal both normally and for fast-path formatting
    eq = eq && compactStyle == other.compactStyle;
    eq = eq && currency == other.currency;
    eq = eq && currencyPluralInfo.fPtr.getAlias() == other.currencyPluralInfo.fPtr.getAlias();
    eq = eq && currencyUsage == other.currencyUsage;
    eq = eq && decimalSeparatorAlwaysShown == other.decimalSeparatorAlwaysShown;
    eq = eq && exponentSignAlwaysShown == other.exponentSignAlwaysShown;
    eq = eq && formatFailIfMoreThanMaxDigits == other.formatFailIfMoreThanMaxDigits;
    eq = eq && formatWidth == other.formatWidth;
    eq = eq && magnitudeMultiplier == other.magnitudeMultiplier;
    eq = eq && maximumSignificantDigits == other.maximumSignificantDigits;
    eq = eq && minimumExponentDigits == other.minimumExponentDigits;
    eq = eq && minimumGroupingDigits == other.minimumGroupingDigits;
    eq = eq && minimumSignificantDigits == other.minimumSignificantDigits;
    eq = eq && multiplier == other.multiplier;
    eq = eq && multiplierScale == other.multiplierScale;
    eq = eq && negativePrefix == other.negativePrefix;
    eq = eq && negativeSuffix == other.negativeSuffix;
    eq = eq && padPosition == other.padPosition;
    eq = eq && padString == other.padString;
    eq = eq && positivePrefix == other.positivePrefix;
    eq = eq && positiveSuffix == other.positiveSuffix;
    eq = eq && roundingIncrement == other.roundingIncrement;
    eq = eq && roundingMode == other.roundingMode;
    eq = eq && secondaryGroupingSize == other.secondaryGroupingSize;
    eq = eq && signAlwaysShown == other.signAlwaysShown;

    if (ignoreForFastFormat) {
        return eq;
    }

    // Properties ignored by fast-path formatting
    // Formatting (special handling required):
    eq = eq && groupingSize == other.groupingSize;
    eq = eq && groupingUsed == other.groupingUsed;
    eq = eq && minimumFractionDigits == other.minimumFractionDigits;
    eq = eq && maximumFractionDigits == other.maximumFractionDigits;
    eq = eq && maximumIntegerDigits == other.maximumIntegerDigits;
    eq = eq && minimumIntegerDigits == other.minimumIntegerDigits;
    eq = eq && negativePrefixPattern == other.negativePrefixPattern;
    eq = eq && negativeSuffixPattern == other.negativeSuffixPattern;
    eq = eq && positivePrefixPattern == other.positivePrefixPattern;
    eq = eq && positiveSuffixPattern == other.positiveSuffixPattern;

    // Parsing (always safe to ignore):
    eq = eq && decimalPatternMatchRequired == other.decimalPatternMatchRequired;
    eq = eq && parseCaseSensitive == other.parseCaseSensitive;
    eq = eq && parseIntegerOnly == other.parseIntegerOnly;
    eq = eq && parseMode == other.parseMode;
    eq = eq && parseNoExponent == other.parseNoExponent;
    eq = eq && parseToBigDecimal == other.parseToBigDecimal;
    eq = eq && parseAllInput == other.parseAllInput;

    return eq;
}